

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2xml.hpp
# Opt level: O2

bool __thiscall ert::JsonSaxConsumer::number_integer(JsonSaxConsumer *this,number_integer_t val)

{
  string local_40;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_20;
  
  std::__cxx11::to_string(&local_40,val);
  local_20._M_delim = '\"';
  local_20._M_escape = '\\';
  local_20._M_string = &local_40;
  std::__detail::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)&this->field_0x1b0,&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  this->has_attributes_ = true;
  return true;
}

Assistant:

bool number_integer(number_integer_t val) override
    {
        current_object_ << std::quoted(std::to_string(val));
        has_attributes_ = true;
        return true;
    }